

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O3

Result __thiscall
wabt::LexerSource::ReadRange
          (LexerSource *this,OffsetRange range,vector<char,_std::allocator<char>_> *out_data)

{
  ulong uVar1;
  size_type __new_size;
  ulong uVar3;
  ulong uVar2;
  
  uVar1 = this->size_;
  uVar3 = range.start;
  if (uVar1 < range.start) {
    uVar3 = uVar1;
  }
  uVar2 = range.end;
  if (uVar1 < range.end) {
    uVar2 = uVar1;
  }
  __new_size = uVar2 - uVar3;
  if (__new_size != 0) {
    std::vector<char,_std::allocator<char>_>::resize(out_data,__new_size);
    memcpy((out_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start,(void *)(uVar3 + (long)this->data_),__new_size);
  }
  return (Result)Ok;
}

Assistant:

Result LexerSource::ReadRange(OffsetRange range, std::vector<char>* out_data) {
  OffsetRange clamped = range;
  clamped.start = std::min(clamped.start, size_);
  clamped.end = std::min(clamped.end, size_);
  if (clamped.size()) {
    out_data->resize(clamped.size());
    const void* src = static_cast<const char*>(data_) + clamped.start;
    memcpy(out_data->data(), src, clamped.size());
  }
  return Result::Ok;
}